

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_stg.c
# Opt level: O0

int IDASetNonlinearSolverSensStg(void *ida_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  N_Vector p_Var2;
  SUNNonlinearSolver in_RSI;
  IDAMem in_RDI;
  int is;
  int retval;
  IDAMem IDA_mem;
  int local_28;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x33,"IDASetNonlinearSolverSensStg",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    IDAProcessError((IDAMem)0x0,-0x16,0x3b,"IDASetNonlinearSolverSensStg",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                    ,"NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0)
           ) || (in_RSI->ops->setsysfn ==
                 (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    IDAProcessError(in_RDI,-0x16,0x44,"IDASetNonlinearSolverSensStg",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                    ,"NLS does not support required operations");
    local_4 = -0x16;
  }
  else {
    iVar1 = SUNNonlinSolGetType(in_RSI);
    if (iVar1 == 0) {
      if (in_RDI->ida_sensi == 0) {
        IDAProcessError(in_RDI,-0x16,0x54,"IDASetNonlinearSolverSensStg",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                        ,"Illegal attempt to call before calling IDASensInit.");
        local_4 = -0x16;
      }
      else if (in_RDI->ida_ism == 2) {
        if ((in_RDI->NLSstg != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLSstg != 0)) {
          SUNNonlinSolFree(in_RDI->NLSstg);
        }
        in_RDI->NLSstg = in_RSI;
        in_RDI->ownNLSstg = 0;
        iVar1 = SUNNonlinSolSetSysFn(in_RDI->NLSstg,idaNlsResidualSensStg);
        if (iVar1 == 0) {
          iVar1 = SUNNonlinSolSetConvTestFn(in_RDI->NLSstg,idaNlsConvTestSensStg,in_RDI);
          if (iVar1 == 0) {
            iVar1 = SUNNonlinSolSetMaxIters(in_RDI->NLSstg,4);
            if (iVar1 == 0) {
              if (in_RDI->stgMallocDone == 0) {
                p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->ida_Ns,in_RDI->ida_sunctx);
                in_RDI->ypredictStg = p_Var2;
                if (in_RDI->ypredictStg == (N_Vector)0x0) {
                  IDAProcessError(in_RDI,-0x15,0x91,"IDASetNonlinearSolverSensStg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                                  ,"A memory request failed.");
                  return -0x15;
                }
                p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->ida_Ns,in_RDI->ida_sunctx);
                in_RDI->ycorStg = p_Var2;
                if (in_RDI->ycorStg == (N_Vector)0x0) {
                  N_VDestroy(in_RDI->ypredictStg);
                  IDAProcessError(in_RDI,-0x15,0x9b,"IDASetNonlinearSolverSensStg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                                  ,"A memory request failed.");
                  return -0x15;
                }
                p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->ida_Ns,in_RDI->ida_sunctx);
                in_RDI->ewtStg = p_Var2;
                if (in_RDI->ewtStg == (N_Vector)0x0) {
                  N_VDestroy(in_RDI->ypredictStg);
                  N_VDestroy(in_RDI->ycorStg);
                  IDAProcessError(in_RDI,-0x15,0xa6,"IDASetNonlinearSolverSensStg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                                  ,"A memory request failed.");
                  return -0x15;
                }
                in_RDI->stgMallocDone = 1;
              }
              for (local_28 = 0; local_28 < in_RDI->ida_Ns; local_28 = local_28 + 1) {
                *(N_Vector *)(*in_RDI->ypredictStg->content + (long)local_28 * 8) =
                     in_RDI->ida_yySpredict[local_28];
                *(N_Vector *)(*in_RDI->ycorStg->content + (long)local_28 * 8) =
                     in_RDI->ida_eeS[local_28];
                *(N_Vector *)(*in_RDI->ewtStg->content + (long)local_28 * 8) =
                     in_RDI->ida_ewtS[local_28];
              }
              local_4 = 0;
            }
            else {
              IDAProcessError(in_RDI,-0x16,0x85,"IDASetNonlinearSolverSensStg",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                              ,"Setting maximum number of nonlinear iterations failed");
              local_4 = -0x16;
            }
          }
          else {
            IDAProcessError(in_RDI,-0x16,0x7c,"IDASetNonlinearSolverSensStg",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                            ,"Setting convergence test function failed");
            local_4 = -0x16;
          }
        }
        else {
          IDAProcessError(in_RDI,-0x16,0x72,"IDASetNonlinearSolverSensStg",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                          ,"Setting nonlinear system function failed");
          local_4 = -0x16;
        }
      }
      else {
        IDAProcessError(in_RDI,-0x16,0x5c,"IDASetNonlinearSolverSensStg",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                        ,"Sensitivity solution method is not IDA_STAGGERED");
        local_4 = -0x16;
      }
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x4c,"IDASetNonlinearSolverSensStg",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                      ,"NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDASetNonlinearSolverSensStg(void* ida_mem, SUNNonlinearSolver NLS)
{
  IDAMem IDA_mem;
  int retval, is;

  /* return immediately if IDA memory is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS must be non-NULL");
    return (IDA_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (IDA_ILL_INPUT);
  }

  /* check for allowed nonlinear solver types */
  if (SUNNonlinSolGetType(NLS) != SUNNONLINEARSOLVER_ROOTFIND)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
    return (IDA_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(IDA_mem->ida_sensi))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_ILL_INPUT);
  }

  /* check that the staggered corrector was selected */
  if (IDA_mem->ida_ism != IDA_STAGGERED)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Sensitivity solution method is not IDA_STAGGERED");
    return (IDA_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((IDA_mem->NLSstg != NULL) && (IDA_mem->ownNLSstg))
  {
    retval = SUNNonlinSolFree(IDA_mem->NLSstg);
  }

  /* set SUNNonlinearSolver pointer */
  IDA_mem->NLSstg = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, IDA will set the flag to SUNTRUE after this function returns. */
  IDA_mem->ownNLSstg = SUNFALSE;

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(IDA_mem->NLSstg, idaNlsResidualSensStg);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (IDA_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(IDA_mem->NLSstg, idaNlsConvTestSensStg,
                                     ida_mem);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (IDA_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(IDA_mem->NLSstg, MAXIT);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (IDA_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (IDA_mem->stgMallocDone == SUNFALSE)
  {
    IDA_mem->ypredictStg = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns,
                                                   IDA_mem->ida_sunctx);
    if (IDA_mem->ypredictStg == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ycorStg = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns,
                                               IDA_mem->ida_sunctx);
    if (IDA_mem->ycorStg == NULL)
    {
      N_VDestroy(IDA_mem->ypredictStg);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ewtStg = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns,
                                              IDA_mem->ida_sunctx);
    if (IDA_mem->ewtStg == NULL)
    {
      N_VDestroy(IDA_mem->ypredictStg);
      N_VDestroy(IDA_mem->ycorStg);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->stgMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    NV_VEC_SW(IDA_mem->ypredictStg, is) = IDA_mem->ida_yySpredict[is];
    NV_VEC_SW(IDA_mem->ycorStg, is)     = IDA_mem->ida_eeS[is];
    NV_VEC_SW(IDA_mem->ewtStg, is)      = IDA_mem->ida_ewtS[is];
  }

  return (IDA_SUCCESS);
}